

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WaitOrderStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::WaitOrderStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,span<const_slang::ast::Expression_*,_18446744073709551615UL> *args,
          Statement **args_1,Statement **args_2,SourceRange *args_3)

{
  SourceRange sourceRange;
  WaitOrderStatement *ifFalse;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  undefined8 *in_R8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> in_stack_ffffffffffffffc8;
  
  ifFalse = (WaitOrderStatement *)
            allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     (size_t)in_stack_ffffffffffffffa8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)ifFalse,
             in_stack_ffffffffffffffa8);
  sourceRange.endLoc = in_RDX;
  sourceRange.startLoc = in_RCX;
  ast::WaitOrderStatement::WaitOrderStatement
            ((WaitOrderStatement *)in_R8[1],in_stack_ffffffffffffffc8,(Statement *)*in_R8,
             &ifFalse->super_Statement,sourceRange);
  return ifFalse;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }